

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O3

void mpp_mem_pool_put_f(char *caller,MppMemPool pool,void *p)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  
  if (*pool != pool) {
    _mpp_log_l(2,"mpp_mem_pool","invalid mem pool %p check %p\n","mpp_mem_pool_put_f",pool);
    return;
  }
  plVar1 = (long *)((long)p + -0x28);
  if (plVar1 != (long *)*plVar1) {
    _mpp_log_l(2,"mpp_mem_pool","invalid mem pool ptr %p node %p check %p\n","mpp_mem_pool_put_f",p,
               plVar1,(long *)*plVar1);
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)pool + 0x18));
  if (((byte)mpp_mem_pool_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_mem_pool","pool %d put used:unused [%d:%d] from %s",(char *)0x0,
               *(undefined8 *)((long)pool + 0x10),(ulong)*(uint *)((long)pool + 0x70),
               (ulong)*(uint *)((long)pool + 0x74),caller);
  }
  lVar2 = (long)p + -0x20;
  lVar3 = *(long *)((long)p + -0x20);
  plVar1 = *(long **)((long)p + -0x18);
  *(long **)(lVar3 + 8) = plVar1;
  *plVar1 = lVar3;
  *(long *)((long)p + -0x20) = lVar2;
  lVar3 = *(long *)((long)pool + 0x60);
  *(long *)(lVar3 + 8) = lVar2;
  *(long *)((long)p + -0x20) = lVar3;
  *(long *)((long)p + -0x18) = (long)pool + 0x60;
  *(long *)((long)pool + 0x60) = lVar2;
  *(ulong *)((long)pool + 0x70) =
       CONCAT44((int)((ulong)*(undefined8 *)((long)pool + 0x70) >> 0x20) + 1,
                (int)*(undefined8 *)((long)pool + 0x70) + -1);
  *(undefined8 *)((long)p + -0x28) = 0;
  pthread_mutex_unlock((pthread_mutex_t *)((long)pool + 0x18));
  return;
}

Assistant:

void mpp_mem_pool_put_f(const char *caller, MppMemPool pool, void *p)
{
    MppMemPoolImpl *impl = (MppMemPoolImpl *)pool;
    MppMemPoolNode *node = (MppMemPoolNode *)((RK_U8 *)p - sizeof(MppMemPoolNode));

    if (impl != impl->check) {
        mpp_err_f("invalid mem pool %p check %p\n", impl, impl->check);
        return ;
    }

    if (node != node->check) {
        mpp_err_f("invalid mem pool ptr %p node %p check %p\n",
                  p, node, node->check);
        return ;
    }

    pthread_mutex_lock(&impl->lock);

    mem_pool_dbg_flow("pool %d put used:unused [%d:%d] from %s", impl->size,
                      impl->used_count, impl->unused_count, caller);

    list_del_init(&node->list);
    list_add(&node->list, &impl->unused);
    impl->used_count--;
    impl->unused_count++;
    node->check = NULL;

    pthread_mutex_unlock(&impl->lock);
}